

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O2

void av1_get_ref_frames(RefFrameMapPair *ref_frame_map_pairs,int cur_frame_disp,AV1_COMP *cpi,
                       int gf_index,int is_parallel_encode,int *remapped_ref_idx)

{
  int iVar1;
  AV1_PRIMARY *pAVar2;
  int i;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  size_t __nmemb;
  ulong uVar13;
  ulong uVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  RefBufMapData buffer_map [8];
  
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    remapped_ref_idx[lVar5] = -1;
  }
  lVar5 = (long)gf_index;
  if ((cpi->use_ducky_encode == 0) || ((cpi->ducky_encode_info).frame_info.gop_mode != '\x01')) {
    buffer_map[7].map_idx = 0;
    buffer_map[7].disp_order = 0;
    buffer_map[7].pyr_level = 0;
    buffer_map[7].used = 0;
    buffer_map[6].map_idx = 0;
    buffer_map[6].disp_order = 0;
    buffer_map[6].pyr_level = 0;
    buffer_map[6].used = 0;
    buffer_map[5].map_idx = 0;
    buffer_map[5].disp_order = 0;
    buffer_map[5].pyr_level = 0;
    buffer_map[5].used = 0;
    buffer_map[4].map_idx = 0;
    buffer_map[4].disp_order = 0;
    buffer_map[4].pyr_level = 0;
    buffer_map[4].used = 0;
    buffer_map[3].map_idx = 0;
    buffer_map[3].disp_order = 0;
    buffer_map[3].pyr_level = 0;
    buffer_map[3].used = 0;
    buffer_map[2].map_idx = 0;
    buffer_map[2].disp_order = 0;
    buffer_map[2].pyr_level = 0;
    buffer_map[2].used = 0;
    buffer_map[1].map_idx = 0;
    buffer_map[1].disp_order = 0;
    buffer_map[1].pyr_level = 0;
    buffer_map[1].used = 0;
    buffer_map[0].map_idx = 0;
    buffer_map[0].disp_order = 0;
    buffer_map[0].pyr_level = 0;
    buffer_map[0].used = 0;
    pAVar2 = cpi->ppi;
    iVar3 = is_one_pass_rt_params(cpi);
    iVar10 = 6;
    uVar20 = 0;
    for (lVar8 = 0; __nmemb = (size_t)(int)uVar20, lVar8 != 8; lVar8 = lVar8 + 1) {
      iVar11 = ref_frame_map_pairs[lVar8].disp_order;
      if (iVar11 != -1) {
        iVar4 = ref_frame_map_pairs[lVar8].pyr_level;
        uVar14 = 0;
        if (0 < (int)uVar20) {
          uVar14 = (ulong)uVar20;
        }
        uVar6 = 0xffffffffffffffff;
        piVar15 = &buffer_map[0].disp_order;
        do {
          uVar16 = uVar14;
          if (uVar6 - uVar14 == -1) break;
          uVar16 = uVar6 + 1;
          iVar12 = *piVar15;
          uVar6 = uVar16;
          piVar15 = piVar15 + 4;
        } while (iVar12 != iVar11);
        if ((long)__nmemb <= (long)uVar16) {
          if (iVar4 < iVar10) {
            iVar10 = iVar4;
          }
          buffer_map[__nmemb].map_idx = (int)lVar8;
          buffer_map[__nmemb].disp_order = iVar11;
          buffer_map[__nmemb].pyr_level = iVar4;
          buffer_map[__nmemb].used = 0;
          uVar20 = uVar20 + 1;
        }
      }
    }
    qsort(buffer_map,__nmemb,0x10,compare_map_idx_pair_asc);
    uVar7 = uVar20 - 1;
    uVar9 = (ulong)uVar7;
    uVar14 = 0xffffffffffffffff;
    bVar21 = false;
    iVar11 = 0;
    uVar6 = 0xffffffff;
    uVar16 = 0xffffffff;
    uVar19 = uVar7;
    while( true ) {
      uVar13 = (ulong)uVar19;
      iVar4 = (int)uVar6;
      if ((int)uVar19 < 0) break;
      uVar17 = uVar16;
      if (buffer_map[uVar13].pyr_level == iVar10) {
        iVar11 = iVar11 + 1;
        iVar12 = buffer_map[uVar13].disp_order;
        if (((((int)uVar16 != -1 || cur_frame_disp <= iVar12) ||
             (uVar17 = uVar13, remapped_ref_idx[3] != -1)) &&
            (uVar17 = uVar16, cur_frame_disp < iVar12)) &&
           (((int)uVar14 == -1 && (uVar14 = 0xffffffff, remapped_ref_idx[6] == -1)))) {
          uVar14 = uVar13;
        }
      }
      else {
        iVar12 = buffer_map[uVar13].disp_order;
        if (buffer_map[uVar13].disp_order == cur_frame_disp) {
          remapped_ref_idx[4] = buffer_map[uVar13].map_idx;
          buffer_map[uVar13].used = 1;
          iVar12 = cur_frame_disp;
        }
      }
      if (((iVar3 == 0) && ((pAVar2->gf_group).frame_parallel_level[lVar5] == 2)) &&
         (((pAVar2->gf_group).frame_parallel_level[lVar5 + -1] == 1 &&
          ((pAVar2->gf_group).update_type[lVar5 + -1] == '\x06')))) {
        piVar15 = (pAVar2->gf_group).skip_frame_as_ref + lVar5;
        iVar18 = iVar12;
        if (is_parallel_encode != 0) {
          iVar18 = buffer_map[uVar13].map_idx;
          piVar15 = &cpi->ref_idx_to_skip;
        }
        iVar1 = *piVar15;
        buffer_map[uVar13].used = (uint)(iVar18 == iVar1);
        if (iVar18 == iVar1) {
          bVar21 = true;
        }
      }
      uVar16 = uVar6;
      if (iVar4 < 0) {
        uVar16 = uVar13;
      }
      if (iVar12 < cur_frame_disp) {
        uVar6 = uVar16;
      }
      uVar19 = uVar19 - 1;
      uVar16 = uVar17;
    }
    if (iVar11 <= (int)uVar20) {
      if (-1 < (int)uVar16) {
        remapped_ref_idx[3] = buffer_map[uVar16].map_idx;
        buffer_map[uVar16].used = 1;
      }
      if (-1 < (int)uVar14) {
        remapped_ref_idx[6] = buffer_map[uVar14 & 0xffffffff].map_idx;
        buffer_map[uVar14 & 0xffffffff].used = 1;
      }
    }
    if (7 < (int)uVar20 && !bVar21) {
      uVar14 = 0xffffffffffffffff;
      piVar15 = &buffer_map[0].used;
      iVar3 = 0;
      for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
        if ((*piVar15 == 0) && ((4 < iVar11 || (piVar15[-1] != iVar10)))) {
          iVar18 = cur_frame_disp - piVar15[-2];
          iVar12 = -iVar18;
          if (0 < iVar18) {
            iVar12 = iVar18;
          }
          if (iVar3 < iVar12) {
            uVar14 = uVar16;
          }
          uVar14 = uVar14 & 0xffffffff;
          if (iVar3 < iVar12) {
            iVar3 = iVar12;
          }
        }
        piVar15 = piVar15 + 4;
      }
      buffer_map[(int)uVar14].used = 1;
    }
    for (lVar5 = 1; lVar5 != 4; lVar5 = lVar5 + 1) {
      if (remapped_ref_idx[lVar5 + -1] == -1) {
        iVar10 = -0x80000000;
        uVar14 = 0;
        for (uVar20 = uVar7; uVar16 = (ulong)uVar20, -1 < (int)uVar20; uVar20 = uVar20 - 1) {
          uVar13 = uVar14;
          iVar3 = iVar10;
          if ((buffer_map[uVar16].used == 0) &&
             (iVar3 = buffer_map[uVar16].disp_order, uVar13 = uVar16,
             cur_frame_disp <= iVar3 || iVar3 <= iVar10)) {
            uVar13 = uVar14;
            iVar3 = iVar10;
          }
          iVar10 = iVar3;
          uVar14 = uVar13;
        }
        if (buffer_map[uVar14].used != 0) break;
        remapped_ref_idx[lVar5 + -1] = buffer_map[uVar14].map_idx;
        buffer_map[uVar14].used = 1;
      }
    }
    for (lVar5 = 5; lVar5 != 8; lVar5 = lVar5 + 1) {
      if (remapped_ref_idx[lVar5 + -1] == -1) {
        iVar10 = 0x7fffffff;
        uVar14 = 0;
        for (uVar20 = uVar7; uVar16 = (ulong)uVar20, -1 < (int)uVar20; uVar20 = uVar20 - 1) {
          uVar13 = uVar14;
          iVar3 = iVar10;
          if ((buffer_map[uVar16].used == 0) &&
             (iVar3 = buffer_map[uVar16].disp_order, uVar13 = uVar16,
             iVar3 <= cur_frame_disp || iVar10 <= iVar3)) {
            uVar13 = uVar14;
            iVar3 = iVar10;
          }
          iVar10 = iVar3;
          uVar14 = uVar13;
        }
        if (buffer_map[uVar14].used != 0) break;
        remapped_ref_idx[lVar5 + -1] = buffer_map[uVar14].map_idx;
        buffer_map[uVar14].used = 1;
      }
    }
    uVar14 = uVar6;
    for (lVar5 = 1; lVar5 != 8; lVar5 = lVar5 + 1) {
      if (remapped_ref_idx[lVar5 + -1] == -1) {
        while( true ) {
          if ((int)uVar14 < 0) goto LAB_0034b400;
          if (buffer_map[uVar14].used == 0) break;
          uVar14 = (ulong)((int)uVar14 - 1);
        }
        remapped_ref_idx[lVar5 + -1] = buffer_map[uVar14].map_idx;
        buffer_map[uVar14].used = 1;
      }
    }
LAB_0034b400:
    lVar5 = 7;
    while (bVar21 = lVar5 != 0, lVar5 = lVar5 + -1, bVar21) {
      if (remapped_ref_idx[lVar5] == -1) {
        uVar14 = uVar6;
        if ((int)uVar9 < iVar4) {
          uVar14 = uVar9;
        }
        while( true ) {
          uVar7 = (uint)uVar9;
          uVar20 = (uint)uVar14;
          if (((int)uVar7 <= iVar4) || (uVar20 = uVar7, buffer_map[uVar9].used == 0)) break;
          uVar9 = (ulong)(uVar7 - 1);
        }
        if (((int)uVar20 < 0) || (buffer_map[uVar20].used != 0)) break;
        remapped_ref_idx[lVar5] = buffer_map[uVar20].map_idx;
        buffer_map[uVar20].used = 1;
        uVar9 = (ulong)uVar20;
      }
    }
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      if (remapped_ref_idx[lVar5] == -1) {
        remapped_ref_idx[lVar5] = 0;
      }
    }
  }
  else {
    pAVar2 = cpi->ppi;
    for (lVar8 = 0; lVar8 != 7; lVar8 = lVar8 + 1) {
      iVar10 = (int)(pAVar2->gf_group).ref_frame_list[lVar5][lVar8 + 1];
      if (iVar10 != -1) {
        remapped_ref_idx[lVar8] = iVar10;
      }
    }
    lVar5 = 0;
    do {
      if (lVar5 == 0x1c) {
        iVar10 = 0;
        break;
      }
      iVar10 = remapped_ref_idx
               [(long)*(int *)((long)av1_get_ref_frames::ref_frame_type_order + lVar5) + -1];
      lVar5 = lVar5 + 4;
    } while (iVar10 == -1);
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      if (remapped_ref_idx[lVar5] == -1) {
        remapped_ref_idx[lVar5] = iVar10;
      }
    }
  }
  return;
}

Assistant:

void av1_get_ref_frames(RefFrameMapPair ref_frame_map_pairs[REF_FRAMES],
                        int cur_frame_disp, const AV1_COMP *cpi, int gf_index,
                        int is_parallel_encode,
                        int remapped_ref_idx[REF_FRAMES]) {
  int buf_map_idx = 0;

  // Initialize reference frame mappings.
  for (int i = 0; i < REF_FRAMES; ++i) remapped_ref_idx[i] = INVALID_IDX;

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    for (int rf = LAST_FRAME; rf < REF_FRAMES; ++rf) {
      if (cpi->ppi->gf_group.ref_frame_list[gf_index][rf] != INVALID_IDX) {
        remapped_ref_idx[rf - LAST_FRAME] =
            cpi->ppi->gf_group.ref_frame_list[gf_index][rf];
      }
    }

    int valid_rf_idx = 0;
    static const int ref_frame_type_order[REF_FRAMES - LAST_FRAME] = {
      GOLDEN_FRAME,  ALTREF_FRAME, LAST_FRAME, BWDREF_FRAME,
      ALTREF2_FRAME, LAST2_FRAME,  LAST3_FRAME
    };
    for (int i = 0; i < REF_FRAMES - LAST_FRAME; i++) {
      int rf = ref_frame_type_order[i];
      if (remapped_ref_idx[rf - LAST_FRAME] != INVALID_IDX) {
        valid_rf_idx = remapped_ref_idx[rf - LAST_FRAME];
        break;
      }
    }

    for (int i = 0; i < REF_FRAMES; ++i) {
      if (remapped_ref_idx[i] == INVALID_IDX) {
        remapped_ref_idx[i] = valid_rf_idx;
      }
    }

    return;
  }
#endif  // !CONFIG_REALTIME_ONLY

  RefBufMapData buffer_map[REF_FRAMES];
  int n_bufs = 0;
  memset(buffer_map, 0, REF_FRAMES * sizeof(buffer_map[0]));
  int min_level = MAX_ARF_LAYERS;
  int max_level = 0;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  int skip_ref_unmapping = 0;
  int is_one_pass_rt = is_one_pass_rt_params(cpi);

  // Go through current reference buffers and store display order, pyr level,
  // and map index.
  for (int map_idx = 0; map_idx < REF_FRAMES; map_idx++) {
    // Get reference frame buffer.
    RefFrameMapPair ref_pair = ref_frame_map_pairs[map_idx];
    if (ref_pair.disp_order == -1) continue;
    const int frame_order = ref_pair.disp_order;
    // Avoid duplicates.
    if (is_in_ref_map(buffer_map, frame_order, n_bufs)) continue;
    const int reference_frame_level = ref_pair.pyr_level;

    // Keep track of the lowest and highest levels that currently exist.
    if (reference_frame_level < min_level) min_level = reference_frame_level;
    if (reference_frame_level > max_level) max_level = reference_frame_level;

    buffer_map[n_bufs].map_idx = map_idx;
    buffer_map[n_bufs].disp_order = frame_order;
    buffer_map[n_bufs].pyr_level = reference_frame_level;
    buffer_map[n_bufs].used = 0;
    n_bufs++;
  }

  // Sort frames in ascending display order.
  qsort(buffer_map, n_bufs, sizeof(buffer_map[0]), compare_map_idx_pair_asc);

  int n_min_level_refs = 0;
  int closest_past_ref = -1;
  int golden_idx = -1;
  int altref_idx = -1;

  // Find the GOLDEN_FRAME and BWDREF_FRAME.
  // Also collect various stats about the reference frames for the remaining
  // mappings.
  for (int i = n_bufs - 1; i >= 0; i--) {
    if (buffer_map[i].pyr_level == min_level) {
      // Keep track of the number of lowest level frames.
      n_min_level_refs++;
      if (buffer_map[i].disp_order < cur_frame_disp && golden_idx == -1 &&
          remapped_ref_idx[GOLDEN_FRAME - LAST_FRAME] == INVALID_IDX) {
        // Save index for GOLDEN.
        golden_idx = i;
      } else if (buffer_map[i].disp_order > cur_frame_disp &&
                 altref_idx == -1 &&
                 remapped_ref_idx[ALTREF_FRAME - LAST_FRAME] == INVALID_IDX) {
        // Save index for ALTREF.
        altref_idx = i;
      }
    } else if (buffer_map[i].disp_order == cur_frame_disp) {
      // Map the BWDREF_FRAME if this is the show_existing_frame.
      add_ref_to_slot(&buffer_map[i], remapped_ref_idx, BWDREF_FRAME);
    }

    // During parallel encodes of lower layer frames, exclude the first frame
    // (frame_parallel_level 1) from being used for the reference assignment of
    // the second frame (frame_parallel_level 2).
    if (!is_one_pass_rt && gf_group->frame_parallel_level[gf_index] == 2 &&
        gf_group->frame_parallel_level[gf_index - 1] == 1 &&
        gf_group->update_type[gf_index - 1] == INTNL_ARF_UPDATE) {
      assert(gf_group->update_type[gf_index] == INTNL_ARF_UPDATE);
#if CONFIG_FPMT_TEST
      is_parallel_encode = (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_ENCODE)
                               ? is_parallel_encode
                               : 0;
#endif  // CONFIG_FPMT_TEST
      // If parallel cpis are active, use ref_idx_to_skip, else, use display
      // index.
      assert(IMPLIES(is_parallel_encode, cpi->ref_idx_to_skip != INVALID_IDX));
      assert(IMPLIES(!is_parallel_encode,
                     gf_group->skip_frame_as_ref[gf_index] != INVALID_IDX));
      buffer_map[i].used = is_parallel_encode
                               ? (buffer_map[i].map_idx == cpi->ref_idx_to_skip)
                               : (buffer_map[i].disp_order ==
                                  gf_group->skip_frame_as_ref[gf_index]);
      // In case a ref frame is excluded from being used during assignment,
      // skip the call to set_unmapped_ref(). Applicable in steady state.
      if (buffer_map[i].used) skip_ref_unmapping = 1;
    }

    // Keep track of where the frames change from being past frames to future
    // frames.
    if (buffer_map[i].disp_order < cur_frame_disp && closest_past_ref < 0)
      closest_past_ref = i;
  }

  // Do not map GOLDEN and ALTREF based on their pyramid level if all reference
  // frames have the same level.
  if (n_min_level_refs <= n_bufs) {
    // Map the GOLDEN_FRAME.
    if (golden_idx > -1)
      add_ref_to_slot(&buffer_map[golden_idx], remapped_ref_idx, GOLDEN_FRAME);
    // Map the ALTREF_FRAME.
    if (altref_idx > -1)
      add_ref_to_slot(&buffer_map[altref_idx], remapped_ref_idx, ALTREF_FRAME);
  }

  // Find the buffer to be excluded from the mapping.
  if (!skip_ref_unmapping)
    set_unmapped_ref(buffer_map, n_bufs, n_min_level_refs, min_level,
                     cur_frame_disp);

  // Place past frames in LAST_FRAME, LAST2_FRAME, and LAST3_FRAME.
  for (int frame = LAST_FRAME; frame < GOLDEN_FRAME; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer
    // in decreasing ouptut order relative to current picture.
    int next_buf_max = 0;
    int next_disp_order = INT_MIN;
    for (buf_map_idx = n_bufs - 1; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used &&
          buffer_map[buf_map_idx].disp_order < cur_frame_disp &&
          buffer_map[buf_map_idx].disp_order > next_disp_order) {
        next_disp_order = buffer_map[buf_map_idx].disp_order;
        next_buf_max = buf_map_idx;
      }
    }
    buf_map_idx = next_buf_max;
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place future frames (if there are any) in BWDREF_FRAME and ALTREF2_FRAME.
  for (int frame = BWDREF_FRAME; frame < REF_FRAMES; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer
    // in increasing ouptut order relative to current picture.
    int next_buf_max = 0;
    int next_disp_order = INT_MAX;
    for (buf_map_idx = n_bufs - 1; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used &&
          buffer_map[buf_map_idx].disp_order > cur_frame_disp &&
          buffer_map[buf_map_idx].disp_order < next_disp_order) {
        next_disp_order = buffer_map[buf_map_idx].disp_order;
        next_buf_max = buf_map_idx;
      }
    }
    buf_map_idx = next_buf_max;
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place remaining past frames.
  buf_map_idx = closest_past_ref;
  for (int frame = LAST_FRAME; frame < REF_FRAMES; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer.
    for (; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used) break;
    }
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place remaining future frames.
  buf_map_idx = n_bufs - 1;
  for (int frame = ALTREF_FRAME; frame >= LAST_FRAME; frame--) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer.
    for (; buf_map_idx > closest_past_ref; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used) break;
    }
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Fill any slots that are empty (should only happen for the first 7 frames).
  for (int i = 0; i < REF_FRAMES; ++i)
    if (remapped_ref_idx[i] == INVALID_IDX) remapped_ref_idx[i] = 0;
}